

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

int compaction_del_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,
                     fdb_doc *doc,uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  ulong uVar6;
  fdb_config *pfVar7;
  long extraout_RDX;
  char *pcVar8;
  char *pcVar9;
  fdb_config *fconfig;
  uint uVar10;
  ulong uVar11;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar12;
  fdb_iterator *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  long lVar16;
  fdb_kvs_handle *unaff_R13;
  fdb_custom_cmp_variable p_Var17;
  fdb_doc **doc_00;
  char *pcVar18;
  fdb_kvs_info *info;
  undefined4 uVar19;
  undefined4 uVar20;
  fdb_kvs_handle *db;
  timeval __test_begin;
  char keybuf [256];
  fdb_file_handle *pfStackY_1630;
  timeval tStackY_1628;
  fdb_config fStackY_1618;
  code *pcStackY_1520;
  fdb_kvs_handle *pfStackY_1518;
  fdb_kvs_handle *pfStackY_1510;
  ulong uStackY_1508;
  fdb_kvs_handle *pfStackY_1500;
  fdb_kvs_config fStackY_14f8;
  timeval tStackY_14e0;
  char *pcStackY_14d0;
  char *pcStackY_14c8;
  fdb_kvs_handle *pfStackY_14c0;
  char *pcStackY_14b8;
  char *pcStackY_14b0;
  code *pcStackY_14a8;
  fdb_file_handle *pfStackY_1498;
  int iStackY_148c;
  fdb_kvs_handle *pfStackY_1488;
  fdb_kvs_handle *pfStackY_1480;
  fdb_kvs_handle *pfStackY_1478;
  fdb_kvs_handle *pfStackY_1470;
  fdb_kvs_handle *pfStackY_1468;
  undefined8 uStackY_1460;
  undefined8 uStackY_1458;
  undefined8 uStackY_1450;
  timeval tStackY_1440;
  fdb_kvs_config fStackY_1430;
  fdb_config fStackY_1418;
  char acStackY_1320 [256];
  char acStackY_1220 [272];
  char *pcStackY_1110;
  fdb_kvs_handle *pfStackY_1108;
  char *pcStackY_10f8;
  code *pcStackY_10f0;
  fdb_snapshot_info_t *pfStackY_10e0;
  fdb_kvs_handle *pfStackY_10d8;
  uint64_t uStackY_10d0;
  timeval tStackY_10c8;
  size_t sStackY_10b8;
  fdb_kvs_handle **ppfStackY_10b0;
  code *pcStackY_10a8;
  fdb_kvs_handle *pfStackY_10a0;
  fdb_kvs_handle *pfStackY_1098;
  fdb_kvs_handle *pfStackY_1090;
  fdb_kvs_handle *pfStackY_1088;
  undefined8 uStackY_1080;
  undefined8 uStackY_1078;
  fdb_kvs_handle *pfStackY_1070;
  timeval tStackY_1060;
  fdb_kvs_config fStackY_1050;
  fdb_config fStackY_1038;
  char acStackY_f40 [256];
  fdb_kvs_handle *apfStackY_e40 [33];
  fdb_config *pfStackY_d38;
  fdb_kvs_handle *pfStackY_d30;
  fdb_kvs_handle *pfStackY_d28;
  char *pcStackY_d20;
  fdb_kvs_handle *pfStackY_d18;
  btree *pbStackY_d10;
  fdb_iterator *pfStack_cf8;
  int iStack_cec;
  fdb_kvs_handle *pfStack_ce8;
  fdb_file_handle *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd8;
  char *pcStack_cd0;
  int iStack_cc8;
  undefined4 uStack_cc4;
  fdb_snapshot_info_t *pfStack_cc0;
  fdb_kvs_handle *pfStack_cb8;
  fdb_kvs_handle *pfStack_cb0;
  long lStack_ca8;
  fdb_kvs_config fStack_ca0;
  char acStack_c88 [256];
  timeval tStack_b88;
  undefined1 auStack_b78 [48];
  fdb_kvs_handle fStack_b48;
  fdb_kvs_handle *pfStack_940;
  fdb_doc **ppfStack_938;
  fdb_kvs_info *pfStack_930;
  btree *pbStack_928;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  fdb_file_handle *pfStack_908;
  fdb_doc *pfStack_900;
  fdb_iterator *pfStack_8f8;
  fdb_snapshot_info_t *pfStack_8f0;
  uint64_t uStack_8e8;
  fdb_kvs_info fStack_8e0;
  timeval tStack_8b0;
  fdb_kvs_config fStack_8a0;
  fdb_config fStack_888;
  fdb_doc *apfStack_790 [32];
  char *pcStack_690;
  fdb_kvs_handle *pfStack_688;
  fdb_kvs_handle *pfStack_680;
  char *pcStack_678;
  fdb_kvs_handle *pfStack_670;
  fdb_kvs_handle *pfStack_660;
  fdb_file_handle *pfStack_658;
  fdb_snapshot_info_t *pfStack_650;
  uint64_t uStack_648;
  undefined1 auStack_640 [16];
  timeval tStack_630;
  fdb_kvs_config fStack_620;
  fdb_kvs_info fStack_608;
  undefined1 auStack_5d8 [292];
  undefined4 uStack_4b4;
  char *pcStack_3e0;
  fdb_kvs_handle *pfStack_3d8;
  fdb_file_handle *pfStack_3b0;
  uint64_t uStack_3a8;
  fdb_snapshot_info_t *pfStack_3a0;
  fdb_kvs_handle *pfStack_398;
  timeval tStack_390;
  fdb_kvs_config fStack_380;
  fdb_config fStack_368;
  char acStack_270 [256];
  fdb_kvs_handle *pfStack_170;
  void *pvStack_168;
  fdb_kvs_handle *pfStack_160;
  fdb_kvs_handle *pfStack_158;
  code *pcStack_150;
  fdb_kvs_handle *local_148;
  fdb_file_handle *local_140;
  timeval local_138;
  
  uVar6 = (ulong)status;
  pcStack_150 = (code *)0x112019;
  gettimeofday(&local_138,(__timezone_ptr_t)0x0);
  pcVar8 = *ctx;
  local_148 = (fdb_kvs_handle *)pcVar8;
  if (status != 0x10) goto LAB_0011219c;
  if (kv_name != (char *)0x0) goto LAB_001121bf;
  if ((fdb_kvs_handle *)pcVar8 == (fdb_kvs_handle *)0x0) {
    return 0;
  }
  pcStack_150 = (code *)0x112054;
  fVar1 = fdb_open(&local_140,"./compact_test1",&fhandle->root->config);
  pfVar5 = (fdb_kvs_handle *)kv_name;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001121c4;
  pcStack_150 = (code *)0x11206c;
  fdb_kvs_open_default(local_140,&local_148,(fdb_kvs_config *)pcVar8);
  pcVar8 = "key%d";
  uVar6 = 0;
  do {
    pcStack_150 = (code *)0x112089;
    sprintf(&stack0xfffffffffffffed8,"key%d",uVar6);
    pfVar5 = local_148;
    pcStack_150 = (code *)0x112095;
    sVar3 = strlen(&stack0xfffffffffffffed8);
    pcStack_150 = (code *)0x1120a3;
    fVar1 = fdb_del_kv(pfVar5,&stack0xfffffffffffffed8,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_150 = (code *)0x112192;
      compaction_del_cb();
      goto LAB_00112192;
    }
    uVar10 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar10;
  } while (uVar10 != 10);
  pcVar8 = "KEY%d";
  uVar6 = 0;
  do {
    pcStack_150 = (code *)0x1120cf;
    sprintf(&stack0xfffffffffffffed8,"KEY%d",uVar6);
    kv_name = (char *)local_148;
    pcStack_150 = (code *)0x1120db;
    sVar3 = strlen(&stack0xfffffffffffffed8);
    pcStack_150 = (code *)0x1120ee;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)kv_name,&stack0xfffffffffffffed8,sVar3,(void *)0x0,0);
    pfVar5 = local_148;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112197;
    pcStack_150 = (code *)0x112102;
    sVar3 = strlen(&stack0xfffffffffffffed8);
    pcStack_150 = (code *)0x112110;
    fVar1 = fdb_del_kv(pfVar5,&stack0xfffffffffffffed8,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112192;
    uVar10 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar10;
  } while (uVar10 != 10);
  pcVar8 = &stack0xfffffffffffffed8;
  pcStack_150 = (code *)0x112136;
  sprintf(pcVar8,"key%d",10);
  fhandle = (fdb_file_handle *)local_148;
  pcStack_150 = (code *)0x112142;
  sVar3 = strlen(pcVar8);
  pcStack_150 = (code *)0x112155;
  fVar1 = fdb_set_kv((fdb_kvs_handle *)fhandle,pcVar8,sVar3,(void *)0x0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001121c9;
  pcStack_150 = (code *)0x112165;
  fVar1 = fdb_commit(local_140,'\0');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_150 = (code *)0x112173;
    fdb_close(local_140);
    *(undefined8 *)ctx = 0;
    return 0;
  }
  goto LAB_001121ce;
LAB_0011271c:
  pfStack_670 = (fdb_kvs_handle *)0x112721;
  wal_delete_compact_upto_test();
LAB_00112721:
  pfStack_670 = (fdb_kvs_handle *)0x112726;
  wal_delete_compact_upto_test();
  goto LAB_00112726;
LAB_00112a8e:
  pbStack_928 = (btree *)0x112a93;
  compact_upto_post_snapshot_test();
LAB_00112a93:
  pbStack_928 = (btree *)0x112a98;
  compact_upto_post_snapshot_test();
LAB_00112a98:
  pbStack_928 = (btree *)0x112a9d;
  compact_upto_post_snapshot_test();
  goto LAB_00112a9d;
LAB_00113134:
  pbStackY_d10 = (btree *)0x113139;
  compact_upto_overwrite_test();
LAB_00113139:
  pbStackY_d10 = (btree *)0x11313e;
  compact_upto_overwrite_test();
LAB_0011313e:
  pbStackY_d10 = (btree *)0x113143;
  compact_upto_overwrite_test();
LAB_00113143:
  pbStackY_d10 = (btree *)0x113153;
  compact_upto_overwrite_test();
LAB_00113153:
  pbStackY_d10 = (btree *)0x11315e;
  compact_upto_overwrite_test();
LAB_0011315e:
  pbStackY_d10 = (btree *)0x113163;
  compact_upto_overwrite_test();
LAB_00113163:
  pbStackY_d10 = (btree *)0x113168;
  compact_upto_overwrite_test();
LAB_00113168:
  pbStackY_d10 = (btree *)0x11316d;
  compact_upto_overwrite_test();
LAB_0011316d:
  pbStackY_d10 = (btree *)0x113172;
  compact_upto_overwrite_test();
LAB_00113172:
  pbStackY_d10 = (btree *)0x113177;
  compact_upto_overwrite_test();
LAB_00113177:
  pbStackY_d10 = (btree *)0x11317c;
  compact_upto_overwrite_test();
  goto LAB_0011317c;
LAB_00112192:
  pcStack_150 = (code *)0x112197;
  compaction_del_cb();
  kv_name = (char *)pfVar5;
LAB_00112197:
  fhandle = (fdb_file_handle *)&stack0xfffffffffffffed8;
  pcStack_150 = (code *)0x11219c;
  compaction_del_cb();
LAB_0011219c:
  iVar2 = (int)uVar6;
  if (iVar2 == 8) {
LAB_001121b5:
    pcStack_150 = (code *)0x1121ba;
    compaction_del_cb();
  }
  else {
    if (iVar2 == 2) {
LAB_001121b0:
      pcStack_150 = (code *)0x1121b5;
      compaction_del_cb();
      goto LAB_001121b5;
    }
    if (iVar2 == 1) {
      pcStack_150 = (code *)0x1121b0;
      compaction_del_cb();
      goto LAB_001121b0;
    }
  }
  pcStack_150 = (code *)0x1121bf;
  compaction_del_cb();
LAB_001121bf:
  pcStack_150 = (code *)0x1121c4;
  compaction_del_cb();
  pfVar5 = (fdb_kvs_handle *)kv_name;
LAB_001121c4:
  pcStack_150 = (code *)0x1121c9;
  compaction_del_cb();
LAB_001121c9:
  pcStack_150 = (code *)0x1121ce;
  compaction_del_cb();
LAB_001121ce:
  pcStack_150 = compact_upto_twice_test;
  compaction_del_cb();
  pvStack_168 = ctx;
  pfStack_170 = (fdb_kvs_handle *)pcVar8;
  pfStack_160 = (fdb_kvs_handle *)fhandle;
  pfStack_158 = pfVar5;
  pcStack_150 = (code *)uVar6;
  gettimeofday(&tStack_390,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_368.wal_threshold = 0x400;
  fStack_368.flags = 1;
  fStack_368.block_reusing_threshold = 0;
  fdb_open(&pfStack_3b0,"./compact_test1",&fStack_368);
  fdb_kvs_open_default(pfStack_3b0,&pfStack_398,&fStack_380);
  uVar6 = 0;
  do {
    sprintf(acStack_270,"key%d",uVar6);
    pfVar5 = pfStack_398;
    sVar3 = strlen(acStack_270);
    fVar1 = fdb_set_kv(pfVar5,acStack_270,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      compact_upto_twice_test();
      goto LAB_001123c5;
    }
    fdb_commit(pfStack_3b0,'\x01');
    uVar10 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar10;
  } while (uVar10 != 10);
  fVar1 = fdb_get_all_snap_markers(pfStack_3b0,&pfStack_3a0,&uStack_3a8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_compact_upto(pfStack_3b0,(char *)0x0,pfStack_3a0[uStack_3a8 - 1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123ca;
    fVar1 = fdb_free_snap_markers(pfStack_3a0,uStack_3a8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123cf;
    fVar1 = fdb_get_all_snap_markers(pfStack_3b0,&pfStack_3a0,&uStack_3a8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123d4;
    fVar1 = fdb_compact_upto(pfStack_3b0,(char *)0x0,pfStack_3a0[uStack_3a8 - 2].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123d9;
    fVar1 = fdb_free_snap_markers(pfStack_3a0,uStack_3a8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_3b0);
      fdb_shutdown();
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (compact_upto_twice_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      iVar2 = fprintf(_stderr,pcVar8,"compact upto twice");
      return iVar2;
    }
  }
  else {
LAB_001123c5:
    compact_upto_twice_test();
LAB_001123ca:
    compact_upto_twice_test();
LAB_001123cf:
    compact_upto_twice_test();
LAB_001123d4:
    compact_upto_twice_test();
LAB_001123d9:
    compact_upto_twice_test();
  }
  compact_upto_twice_test();
  pfStack_3d8 = pfVar5;
  pcStack_3e0 = "key%d";
  pfStack_670 = (fdb_kvs_handle *)0x112400;
  gettimeofday(&tStack_630,(__timezone_ptr_t)0x0);
  pfStack_670 = (fdb_kvs_handle *)0x112405;
  memleak_start();
  pfStack_670 = (fdb_kvs_handle *)0x112411;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_670 = (fdb_kvs_handle *)0x112421;
  fdb_get_default_config();
  pfStack_670 = (fdb_kvs_handle *)0x11242e;
  fdb_get_default_kvs_config();
  auStack_5d8._272_8_ = (void *)0x13;
  uStack_4b4 = 1;
  pfStack_670 = (fdb_kvs_handle *)0x112454;
  fdb_open(&pfStack_658,"./compact_test5",(fdb_config *)(auStack_5d8 + 0x100));
  pfStack_670 = (fdb_kvs_handle *)0x112464;
  fdb_kvs_open_default(pfStack_658,&pfStack_660,&fStack_620);
  pcVar9 = "key%d";
  pcVar8 = auStack_5d8;
  pcVar18 = "value";
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_670 = (fdb_kvs_handle *)0x11248b;
    sprintf(pcVar8,"key%d",pfVar5);
    pfVar14 = pfStack_660;
    pfStack_670 = (fdb_kvs_handle *)0x112498;
    sVar3 = strlen(pcVar8);
    pfStack_670 = (fdb_kvs_handle *)0x1124af;
    fVar1 = fdb_set_kv(pfVar14,pcVar8,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_670 = (fdb_kvs_handle *)0x11271c;
      wal_delete_compact_upto_test();
      goto LAB_0011271c;
    }
    uVar10 = (int)pfVar5 + 1;
    pfVar5 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_670 = (fdb_kvs_handle *)0x1124cd;
  fVar1 = fdb_commit(pfStack_658,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar9 = (char *)0xa;
    pcVar8 = "key%d";
    pcVar18 = auStack_5d8;
    pfVar14 = (fdb_kvs_handle *)0x14cf20;
    do {
      pfStack_670 = (fdb_kvs_handle *)0x1124ff;
      sprintf(pcVar18,"key%d",pcVar9);
      unaff_R13 = pfStack_660;
      pfStack_670 = (fdb_kvs_handle *)0x11250c;
      sVar3 = strlen(pcVar18);
      pfStack_670 = (fdb_kvs_handle *)0x112523;
      fVar1 = fdb_set_kv(unaff_R13,pcVar18,sVar3,"value",5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011271c;
      uVar10 = (int)pcVar9 + 1;
      pcVar9 = (char *)(ulong)uVar10;
    } while (uVar10 != 0x14);
    pcVar9 = (char *)0xf;
    pcVar8 = "key%d";
    pcVar18 = auStack_5d8;
    do {
      pfStack_670 = (fdb_kvs_handle *)0x112555;
      sprintf(pcVar18,"key%d",pcVar9);
      pfVar14 = pfStack_660;
      pfStack_670 = (fdb_kvs_handle *)0x112562;
      sVar3 = strlen(pcVar18);
      pfStack_670 = (fdb_kvs_handle *)0x112570;
      fVar1 = fdb_del_kv(pfVar14,pcVar18,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112721;
      uVar10 = (int)pcVar9 + 1;
      pcVar9 = (char *)(ulong)uVar10;
    } while (uVar10 != 0x14);
    pfStack_670 = (fdb_kvs_handle *)0x11258b;
    fVar1 = fdb_commit(pfStack_658,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112730;
    pcVar9 = auStack_5d8;
    pfStack_670 = (fdb_kvs_handle *)0x1125b1;
    sprintf(pcVar9,"key%d",0x14);
    pcVar8 = (char *)pfStack_660;
    pfStack_670 = (fdb_kvs_handle *)0x1125be;
    sVar3 = strlen(pcVar9);
    pfStack_670 = (fdb_kvs_handle *)0x1125d9;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar8,pcVar9,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112735;
    pfStack_670 = (fdb_kvs_handle *)0x1125ed;
    fVar1 = fdb_commit(pfStack_658,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011273a;
    pfStack_670 = (fdb_kvs_handle *)0x112609;
    fVar1 = fdb_get_all_snap_markers(pfStack_658,&pfStack_650,&uStack_648);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011273f;
    pfStack_670 = (fdb_kvs_handle *)0x112626;
    fVar1 = fdb_compact_upto(pfStack_658,(char *)0x0,pfStack_650[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112744;
    pfStack_670 = (fdb_kvs_handle *)0x11263d;
    fVar1 = fdb_free_snap_markers(pfStack_650,uStack_648);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112749;
    pfStack_670 = (fdb_kvs_handle *)0x112654;
    fVar1 = fdb_get_kvs_info(pfStack_660,&fStack_608);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar9 = (char *)0xf;
      pcVar8 = "key%d";
      pcVar18 = auStack_5d8;
      pfVar14 = (fdb_kvs_handle *)(auStack_640 + 8);
      unaff_R13 = (fdb_kvs_handle *)auStack_640;
      while( true ) {
        pfStack_670 = (fdb_kvs_handle *)0x112689;
        sprintf(pcVar18,"key%d",pcVar9);
        pfVar5 = pfStack_660;
        pfStack_670 = (fdb_kvs_handle *)0x112696;
        sVar3 = strlen(pcVar18);
        pfStack_670 = (fdb_kvs_handle *)0x1126aa;
        fVar1 = fdb_get_kv(pfVar5,pcVar18,sVar3,(void **)pfVar14,(size_t *)unaff_R13);
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
        uVar10 = (int)pcVar9 + 1;
        pcVar9 = (char *)(ulong)uVar10;
        if (uVar10 == 0x14) {
          pfStack_670 = (fdb_kvs_handle *)0x1126c0;
          fdb_kvs_close(pfStack_660);
          pfStack_670 = (fdb_kvs_handle *)0x1126ca;
          fdb_close(pfStack_658);
          pfStack_670 = (fdb_kvs_handle *)0x1126cf;
          fdb_shutdown();
          pfStack_670 = (fdb_kvs_handle *)0x1126d4;
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (wal_delete_compact_upto_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          pfStack_670 = (fdb_kvs_handle *)0x112705;
          iVar2 = fprintf(_stderr,pcVar8,"compact upto with wal deletes test");
          return iVar2;
        }
      }
LAB_00112726:
      pfStack_670 = (fdb_kvs_handle *)0x11272b;
      wal_delete_compact_upto_test();
      goto LAB_0011272b;
    }
  }
  else {
LAB_0011272b:
    pfStack_670 = (fdb_kvs_handle *)0x112730;
    wal_delete_compact_upto_test();
LAB_00112730:
    pfStack_670 = (fdb_kvs_handle *)0x112735;
    wal_delete_compact_upto_test();
LAB_00112735:
    pfStack_670 = (fdb_kvs_handle *)0x11273a;
    wal_delete_compact_upto_test();
LAB_0011273a:
    pfStack_670 = (fdb_kvs_handle *)0x11273f;
    wal_delete_compact_upto_test();
LAB_0011273f:
    pfStack_670 = (fdb_kvs_handle *)0x112744;
    wal_delete_compact_upto_test();
LAB_00112744:
    pfStack_670 = (fdb_kvs_handle *)0x112749;
    wal_delete_compact_upto_test();
LAB_00112749:
    pfStack_670 = (fdb_kvs_handle *)0x11274e;
    wal_delete_compact_upto_test();
  }
  pfStack_670 = (fdb_kvs_handle *)compact_upto_post_snapshot_test;
  wal_delete_compact_upto_test();
  pbStack_928 = (btree *)0x112771;
  pcStack_690 = pcVar9;
  pfStack_688 = pfVar14;
  pfStack_680 = (fdb_kvs_handle *)pcVar8;
  pcStack_678 = pcVar18;
  pfStack_670 = pfVar5;
  gettimeofday(&tStack_8b0,(__timezone_ptr_t)0x0);
  pbStack_928 = (btree *)0x112776;
  memleak_start();
  pfStack_900 = (fdb_doc *)0x0;
  pbStack_928 = (btree *)0x112787;
  system("rm -rf  compact_test* > errorlog.txt");
  pbStack_928 = (btree *)0x112797;
  fdb_get_default_config();
  pbStack_928 = (btree *)0x1127a7;
  fdb_get_default_kvs_config();
  fStack_888.wal_threshold = 0x400;
  fStack_888.flags = 1;
  fStack_888.block_reusing_threshold = 0;
  pbStack_928 = (btree *)0x1127d4;
  fdb_open(&pfStack_908,"./compact_test1",&fStack_888);
  pbStack_928 = (btree *)0x1127e4;
  fdb_kvs_open_default(pfStack_908,&pfStack_910,&fStack_8a0);
  pcVar8 = "key%d";
  doc_00 = apfStack_790;
  info = (fdb_kvs_info *)0x14cf20;
  pcVar9 = (char *)0x0;
  do {
    pbStack_928 = (btree *)0x11280b;
    sprintf((char *)doc_00,"key%d",pcVar9);
    pfVar5 = pfStack_910;
    pbStack_928 = (btree *)0x112818;
    sVar3 = strlen((char *)doc_00);
    pbStack_928 = (btree *)0x11282f;
    pfVar14 = pfVar5;
    fVar1 = fdb_set_kv(pfVar5,doc_00,sVar3,"value",5);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pbStack_928 = (btree *)0x112a8e;
      compact_upto_post_snapshot_test();
      goto LAB_00112a8e;
    }
    pbStack_928 = (btree *)0x112846;
    fdb_commit(pfStack_908,'\x01');
    uVar10 = (int)pcVar9 + 1;
    pcVar9 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pbStack_928 = (btree *)0x11285c;
  pfVar14 = pfStack_910;
  fVar1 = fdb_get_kvs_info(pfStack_910,&fStack_8e0);
  iVar2 = (int)pfVar14;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar8 = (char *)&fStack_8e0.last_seqnum;
    if (fStack_8e0.last_seqnum != 10) {
      pbStack_928 = (btree *)0x112877;
      compact_upto_post_snapshot_test();
    }
    pbStack_928 = (btree *)0x11288b;
    pfVar14 = pfStack_910;
    fVar1 = fdb_snapshot_open(pfStack_910,&pfStack_918,5);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa2;
    pbStack_928 = (btree *)0x1128a2;
    pfVar14 = pfStack_918;
    fVar1 = fdb_get_kvs_info(pfStack_918,&fStack_8e0);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa7;
    if (fStack_8e0.last_seqnum != 5) {
      pbStack_928 = (btree *)0x1128ba;
      compact_upto_post_snapshot_test();
    }
    pbStack_928 = (btree *)0x1128ce;
    pfVar12 = pfStack_908;
    fVar1 = fdb_get_all_snap_markers(pfStack_908,&pfStack_8f0,&uStack_8e8);
    iVar2 = (int)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aac;
    pbStack_928 = (btree *)0x1128eb;
    pfVar12 = pfStack_908;
    fVar1 = fdb_compact_upto(pfStack_908,(char *)0x0,pfStack_8f0[5].marker);
    iVar2 = (int)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab1;
    pbStack_928 = (btree *)0x112902;
    fVar1 = fdb_free_snap_markers(pfStack_8f0,uStack_8e8);
    iVar2 = (int)pfStack_8f0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab6;
    pbStack_928 = (btree *)0x112919;
    pfVar14 = pfStack_910;
    fVar1 = fdb_get_kvs_info(pfStack_910,&fStack_8e0);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112abb;
    if (fStack_8e0.last_seqnum != 10) {
      pbStack_928 = (btree *)0x112931;
      compact_upto_post_snapshot_test();
    }
    pbStack_928 = (btree *)0x112940;
    pfVar14 = pfStack_918;
    fVar1 = fdb_get_kvs_info(pfStack_918,&fStack_8e0);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac0;
    if (fStack_8e0.last_seqnum != 5) {
      pbStack_928 = (btree *)0x112958;
      compact_upto_post_snapshot_test();
    }
    pbStack_928 = (btree *)0x112978;
    pfVar14 = pfStack_918;
    fVar1 = fdb_iterator_init(pfStack_918,&pfStack_8f8,(void *)0x0,0,(void *)0x0,0,0);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac5;
    pcVar9 = (char *)0x5;
    doc_00 = &pfStack_900;
    info = &fStack_8e0;
    do {
      pbStack_928 = (btree *)0x11299c;
      pfVar13 = pfStack_8f8;
      fVar1 = fdb_iterator_get(pfStack_8f8,doc_00);
      iVar2 = (int)pfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a8e;
      pbStack_928 = (btree *)0x1129ae;
      fdb_doc_free(pfStack_900);
      pfStack_900 = (fdb_doc *)0x0;
      pbStack_928 = (btree *)0x1129c4;
      pfVar14 = pfStack_910;
      fVar1 = fdb_get_kvs_info(pfStack_910,info);
      iVar2 = (int)pfVar14;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a93;
      if (fStack_8e0.last_seqnum != 10) {
        pbStack_928 = (btree *)0x112a0c;
        compact_upto_post_snapshot_test();
      }
      pbStack_928 = (btree *)0x1129e1;
      pfVar14 = pfStack_918;
      fVar1 = fdb_get_kvs_info(pfStack_918,info);
      iVar2 = (int)pfVar14;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a98;
      if (fStack_8e0.last_seqnum != 5) {
        pbStack_928 = (btree *)0x112a16;
        compact_upto_post_snapshot_test();
      }
      pbStack_928 = (btree *)0x1129fb;
      pfVar13 = pfStack_8f8;
      fVar1 = fdb_iterator_next(pfStack_8f8);
      iVar2 = (int)pfVar13;
      uVar10 = (int)pcVar9 - 1;
      pcVar9 = (char *)(ulong)uVar10;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar10 == 0) {
      pbStack_928 = (btree *)0x112a2a;
      fdb_iterator_close(pfStack_8f8);
      pbStack_928 = (btree *)0x112a34;
      fdb_kvs_close(pfStack_918);
      pbStack_928 = (btree *)0x112a3e;
      fdb_close(pfStack_908);
      pbStack_928 = (btree *)0x112a43;
      fdb_shutdown();
      pbStack_928 = (btree *)0x112a48;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pbStack_928 = (btree *)0x112a79;
      iVar2 = fprintf(_stderr,pcVar8,"compact upto post snapshot test");
      return iVar2;
    }
  }
  else {
LAB_00112a9d:
    pbStack_928 = (btree *)0x112aa2;
    compact_upto_post_snapshot_test();
LAB_00112aa2:
    pbStack_928 = (btree *)0x112aa7;
    compact_upto_post_snapshot_test();
LAB_00112aa7:
    pbStack_928 = (btree *)0x112aac;
    compact_upto_post_snapshot_test();
LAB_00112aac:
    pbStack_928 = (btree *)0x112ab1;
    compact_upto_post_snapshot_test();
LAB_00112ab1:
    pbStack_928 = (btree *)0x112ab6;
    compact_upto_post_snapshot_test();
LAB_00112ab6:
    pbStack_928 = (btree *)0x112abb;
    compact_upto_post_snapshot_test();
LAB_00112abb:
    pbStack_928 = (btree *)0x112ac0;
    compact_upto_post_snapshot_test();
LAB_00112ac0:
    pbStack_928 = (btree *)0x112ac5;
    compact_upto_post_snapshot_test();
LAB_00112ac5:
    pbStack_928 = (btree *)0x112aca;
    compact_upto_post_snapshot_test();
  }
  pbStack_928 = (btree *)compact_upto_overwrite_test;
  compact_upto_post_snapshot_test();
  fStack_b48.bub_ctx.handle = pfVar5;
  pfVar14 = (fdb_kvs_handle *)0x0;
  pbStackY_d10 = (btree *)0x112af6;
  iStack_cec = iVar2;
  fStack_b48.bub_ctx.space_used = (uint64_t)pcVar8;
  pfStack_940 = unaff_R13;
  ppfStack_938 = doc_00;
  pfStack_930 = info;
  pbStack_928 = (btree *)pcVar9;
  gettimeofday(&tStack_b88,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_c88,"rm -rf  compact_test* > errorlog.txt",0x25);
  pbStackY_d10 = (btree *)0x112b26;
  system(acStack_c88);
  pbStackY_d10 = (btree *)0x112b2b;
  memleak_start();
  pbStackY_d10 = (btree *)0x112b35;
  pcVar8 = (char *)malloc(0x20);
  fconfig = (fdb_config *)(auStack_b78 + 0x130);
  pbStackY_d10 = (btree *)0x112b48;
  fdb_get_default_config();
  fStack_b48.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_b48.config.encryption_key.bytes[0x1d] = '\x02';
  fStack_b48.config.encryption_key.bytes[0x14] = 1;
  fStack_b48.config.num_keeping_headers._0_1_ = 1;
  fStack_b48.config.encryption_key.bytes[4] = '\0';
  fStack_b48.config.encryption_key.bytes[5] = '\0';
  fStack_b48.config.encryption_key.bytes[6] = '\0';
  fStack_b48.config.encryption_key.bytes[7] = '\0';
  fStack_b48.config.encryption_key.bytes[8] = '\0';
  fStack_b48.config.encryption_key.bytes[9] = '\0';
  fStack_b48.config.encryption_key.bytes[10] = '\0';
  fStack_b48.config.encryption_key.bytes[0xb] = '\0';
  fStack_b48.max_seqnum = 0;
  pbStackY_d10 = (btree *)0x112b6b;
  fdb_get_default_kvs_config();
  pbStackY_d10 = (btree *)0x112b7f;
  fVar1 = fdb_open(&pfStack_ce0,"./compact_test",fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011317c:
    pbStackY_d10 = (btree *)0x113181;
    compact_upto_overwrite_test();
LAB_00113181:
    pbStackY_d10 = (btree *)0x113186;
    compact_upto_overwrite_test();
LAB_00113186:
    pbStackY_d10 = (btree *)0x11318b;
    compact_upto_overwrite_test();
LAB_0011318b:
    pbStackY_d10 = (btree *)0x113190;
    compact_upto_overwrite_test();
LAB_00113190:
    pbStackY_d10 = (btree *)0x113195;
    compact_upto_overwrite_test();
LAB_00113195:
    pbStackY_d10 = (btree *)0x11319a;
    compact_upto_overwrite_test();
LAB_0011319a:
    pbStackY_d10 = (btree *)0x11319f;
    compact_upto_overwrite_test();
LAB_0011319f:
    pbStackY_d10 = (btree *)0x1131a4;
    compact_upto_overwrite_test();
LAB_001131a4:
    pbStackY_d10 = (btree *)0x1131a9;
    compact_upto_overwrite_test();
LAB_001131a9:
    pbStackY_d10 = (btree *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_10a8 = (code *)0x1131cb;
    pfStackY_d38 = fconfig;
    pfStackY_d30 = pfVar5;
    pfStackY_d28 = unaff_R13;
    pcStackY_d20 = pcVar8;
    pfStackY_d18 = pfVar14;
    pbStackY_d10 = (btree *)pcVar9;
    gettimeofday(&tStackY_1060,(__timezone_ptr_t)0x0);
    pcStackY_10a8 = (code *)0x1131d0;
    memleak_start();
    pcStackY_10a8 = (code *)0x1131dd;
    fdb_get_default_config();
    pcStackY_10a8 = (code *)0x1131ea;
    fdb_get_default_kvs_config();
    fStackY_1038.compaction_cb_ctx = &uStackY_1080;
    uStackY_1080 = 0;
    uStackY_1078 = 0;
    pfStackY_1070 = (fdb_kvs_handle *)0x0;
    fStackY_1038.wal_threshold = 0x400;
    fStackY_1038.flags = 1;
    fStackY_1038.compaction_cb = compaction_cb_get;
    fStackY_1038.compaction_cb_mask = 0x1b;
    pcStackY_10a8 = (code *)0x113230;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_10a8 = (code *)0x113245;
    fdb_open((fdb_file_handle **)&pfStackY_10a0,"./compact_test1",&fStackY_1038);
    pcStackY_10a8 = (code *)0x11325f;
    fdb_kvs_open((fdb_file_handle *)pfStackY_10a0,&pfStackY_1088,"db",&fStackY_1050);
    pcStackY_10a8 = (code *)0x113272;
    fdb_kvs_open((fdb_file_handle *)pfStackY_10a0,&pfStackY_1098,"db",&fStackY_1050);
    uVar6 = 0;
    do {
      pcStackY_10a8 = (code *)0x11329e;
      sprintf((char *)apfStackY_e40,"key%04d",uVar6);
      pcStackY_10a8 = (code *)0x1132ad;
      sprintf(acStackY_f40,"body%04d",uVar6);
      pfVar5 = pfStackY_1088;
      pcStackY_10a8 = (code *)0x1132ba;
      sVar3 = strlen((char *)apfStackY_e40);
      pcStackY_10a8 = (code *)0x1132c5;
      sVar4 = strlen(acStackY_f40);
      pcStackY_10a8 = (code *)0x1132d9;
      ptr_handle = apfStackY_e40;
      pfVar14 = pfVar5;
      fVar1 = fdb_set_kv(pfVar5,apfStackY_e40,sVar3,acStackY_f40,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_10a8 = (code *)0x11339e;
        compact_with_snapshot_open_test();
        goto LAB_0011339e;
      }
      uVar10 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar10;
    } while (uVar10 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_10a8 = (code *)0x1132f9;
    pfVar14 = pfStackY_10a0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_10a0,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_1070 = pfStackY_1098;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_10a8 = (code *)0x113316;
      pfVar14 = pfStackY_10a0;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_10a0,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a3;
      ptr_handle = &pfStackY_1090;
      pcStackY_10a8 = (code *)0x113332;
      pfVar14 = pfStackY_1098;
      fVar1 = fdb_snapshot_open(pfStackY_1098,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a8;
      pcStackY_10a8 = (code *)0x113340;
      fdb_kvs_close(pfStackY_1090);
      pcStackY_10a8 = (code *)0x113349;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_10a0);
      pfVar14 = pfStackY_10a0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133ad;
      pcStackY_10a8 = (code *)0x113352;
      fVar1 = fdb_shutdown();
      pfVar14 = pfStackY_10a0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar8 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pcStackY_10a8 = (code *)0x113387;
        iVar2 = fprintf(_stderr,pcVar8,"compact with snapshot_open test");
        return iVar2;
      }
    }
    else {
LAB_0011339e:
      pcStackY_10a8 = (code *)0x1133a3;
      compact_with_snapshot_open_test();
LAB_001133a3:
      pcStackY_10a8 = (code *)0x1133a8;
      compact_with_snapshot_open_test();
LAB_001133a8:
      pcStackY_10a8 = (code *)0x1133ad;
      compact_with_snapshot_open_test();
LAB_001133ad:
      pcStackY_10a8 = (code *)0x1133b2;
      compact_with_snapshot_open_test();
    }
    pcStackY_10a8 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_10f0 = (code *)0x1133d3;
    sStackY_10b8 = sVar3;
    ppfStackY_10b0 = apfStackY_e40;
    pcStackY_10a8 = (code *)uVar6;
    gettimeofday(&tStackY_10c8,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX == 0) {
        pcStackY_10f0 = (code *)0x1133e2;
        compaction_cb_get();
        goto LAB_001133e2;
      }
    }
    else {
LAB_001133e2:
      if (extraout_RDX != 0) goto LAB_00113449;
    }
    pcStackY_10f0 = (code *)0x1133f9;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar14,&pfStackY_10e0,&uStackY_10d0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_10f0 = (code *)0x11341d;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_1098->kvs_config).custom_cmp_param,
                                &pfStackY_10d8,pfStackY_10e0->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011343f;
      pcStackY_10f0 = (code *)0x11342b;
      fVar1 = fdb_kvs_close(pfStackY_10d8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return 0;
      }
    }
    else {
      pcStackY_10f0 = (code *)0x11343f;
      compaction_cb_get();
LAB_0011343f:
      pcStackY_10f0 = (code *)0x113444;
      compaction_cb_get();
    }
    pcStackY_10f0 = (code *)0x113449;
    compaction_cb_get();
LAB_00113449:
    pcStackY_10f0 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_10f8 = "body%04d";
    pfStackY_1108 = pfVar5;
    pcStackY_14a8 = (code *)0x11346b;
    pcStackY_1110 = acStackY_f40;
    pcStackY_10f0 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_1440,(__timezone_ptr_t)0x0);
    pcStackY_14a8 = (code *)0x113470;
    memleak_start();
    pcStackY_14a8 = (code *)0x113480;
    fdb_get_default_config();
    pcStackY_14a8 = (code *)0x11348d;
    fdb_get_default_kvs_config();
    fStackY_1418.compaction_cb_ctx = &uStackY_1460;
    uStackY_1460 = 0;
    uStackY_1458 = 0;
    uStackY_1450 = 0;
    fStackY_1418.wal_threshold = 0x400;
    fStackY_1418.flags = 1;
    fStackY_1418.compaction_cb = compaction_cb_markers;
    fStackY_1418.compaction_cb_mask = 0x1b;
    pcStackY_14a8 = (code *)0x1134d3;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_14a8 = (code *)0x1134ea;
    fdb_open(&pfStackY_1498,"./compact_test1",&fStackY_1418);
    pcStackY_14a8 = (code *)0x113501;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1468,"db1",&fStackY_1430);
    pcStackY_14a8 = (code *)0x113518;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1470,"db2",&fStackY_1430);
    pcStackY_14a8 = (code *)0x11352f;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1478,"db3",&fStackY_1430);
    pcStackY_14a8 = (code *)0x113546;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1480,"db4",&fStackY_1430);
    pcStackY_14a8 = (code *)0x11355d;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1488,"db5",&fStackY_1430);
    uVar6 = 0;
    do {
      iVar2 = (int)uVar6;
      if (iVar2 == 5) goto LAB_001136e1;
      uVar6 = 0;
      iStackY_148c = iVar2;
      do {
        pcStackY_14a8 = (code *)0x11359b;
        sprintf(acStackY_1220,"key%04d",uVar6);
        pcStackY_14a8 = (code *)0x1135aa;
        sprintf(acStackY_1320,"body%04d",uVar6);
        pfVar5 = pfStackY_1468;
        pcStackY_14a8 = (code *)0x1135b7;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x1135c5;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x1135d9;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar5 = pfStackY_1470;
        pcStackY_14a8 = (code *)0x1135e6;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x1135f1;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x113605;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar5 = pfStackY_1478;
        pcStackY_14a8 = (code *)0x113612;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x11361d;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x113631;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar5 = pfStackY_1480;
        pcStackY_14a8 = (code *)0x11363e;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x113649;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x11365d;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar14 = pfStackY_1488;
        pcStackY_14a8 = (code *)0x11366a;
        pfVar5 = (fdb_kvs_handle *)strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x113675;
        sVar3 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x113693;
        fdb_set_kv(pfVar14,acStackY_1220,(size_t)pfVar5,acStackY_1320,sVar3);
        uVar10 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar10;
      } while (uVar10 != 1000);
      pcStackY_14a8 = (code *)0x1136b0;
      pfVar12 = pfStackY_1498;
      fVar1 = fdb_commit(pfStackY_1498,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_14a8 = (code *)0x113740;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_00113740;
      }
      uVar6 = (ulong)(iStackY_148c + 1U);
      uStackY_1460 = CONCAT44(uStackY_1460._4_4_,(iStackY_148c + 1U) * 1000);
      pcStackY_14a8 = (code *)0x1136d4;
      fVar1 = fdb_compact(pfStackY_1498,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_14a8 = (code *)0x1136e1;
    compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
    pcStackY_14a8 = (code *)0x1136eb;
    pfVar12 = pfStackY_1498;
    fVar1 = fdb_close(pfStackY_1498);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_14a8 = (code *)0x1136f4;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar8 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pcStackY_14a8 = (code *)0x113729;
        iVar2 = fprintf(_stderr,pcVar8,"compact with snapshot_open multi kvs test");
        return iVar2;
      }
    }
    else {
LAB_00113740:
      pcStackY_14a8 = (code *)0x113745;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_14a8 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_14b0 = "body%04d";
    pcStackY_14d0 = "key%04d";
    pcStackY_1520 = (code *)0x11376f;
    pcStackY_14c8 = acStackY_1320;
    pfStackY_14c0 = pfVar5;
    pcStackY_14b8 = acStackY_1220;
    pcStackY_14a8 = (code *)uVar6;
    gettimeofday(&tStackY_14e0,(__timezone_ptr_t)0x0);
    pcStackY_1520 = (code *)0x113779;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_1498->root;
    pcStackY_1520 = (code *)0x11378c;
    fVar1 = fdb_get_all_snap_markers(pfVar12,(fdb_snapshot_info_t **)&pfStackY_1518,&uStackY_1508);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfVar5 = pfStackY_1518;
      if ((pfStackY_1518->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
        pcStackY_1520 = (code *)0x113870;
        compaction_cb_markers();
        pfVar5 = pfStackY_1510;
      }
      if (*(fdb_seqnum_t *)((long)(pfVar5->kvs_config).custom_cmp_param + 8) == (long)iVar2) {
        if (uStackY_1508 != 0) {
          uVar11 = 0;
          uVar6 = uStackY_1508;
          do {
            if ((&pfVar5->kvs_config)[uVar11].custom_cmp != (fdb_custom_cmp_variable)0x0) {
              lVar16 = 0;
              p_Var17 = (fdb_custom_cmp_variable)0x0;
              do {
                pcVar8 = *(char **)((long)(&pfVar5->kvs_config)[uVar11].custom_cmp_param + lVar16);
                if (pcVar8 != (char *)0x0) {
                  pcStackY_1520 = (code *)0x1137fa;
                  fdb_kvs_open(pfVar12,&pfStackY_1510,pcVar8,&fStackY_14f8);
                  pcStackY_1520 = (code *)0x11380c;
                  fVar1 = fdb_snapshot_open(pfStackY_1510,&pfStackY_1500,(long)iVar2);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_1520 = (code *)0x11381a;
                    fVar1 = fdb_kvs_close(pfStackY_1500);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_1520 = (code *)0x11387d;
                      compaction_cb_markers();
                      goto LAB_0011387d;
                    }
                    pcStackY_1520 = (code *)0x113828;
                    fVar1 = fdb_kvs_close(pfStackY_1510);
                    pfVar5 = pfStackY_1518;
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                  }
                  else {
LAB_0011387d:
                    pcStackY_1520 = (code *)0x113882;
                    compaction_cb_markers();
                  }
                  pcStackY_1520 = (code *)0x113887;
                  compaction_cb_markers();
                  goto LAB_00113887;
                }
LAB_00113830:
                p_Var17 = p_Var17 + 1;
                lVar16 = lVar16 + 0x10;
                uVar6 = uStackY_1508;
              } while (p_Var17 < (&pfVar5->kvs_config)[uVar11].custom_cmp);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        return 0;
      }
    }
    else {
LAB_00113887:
      pcStackY_1520 = (code *)0x11388c;
      compaction_cb_markers();
    }
    pcStackY_1520 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_1628,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_1618.compaction_cb = cb_cancel_test;
    fStackY_1618.compaction_cb_ctx = (void *)0x0;
    fStackY_1618.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_1630,"compact_test",&fStackY_1618);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_1630,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_1630);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pbStackY_d10 = (btree *)0x112ba2;
  fVar1 = fdb_kvs_open(pfStack_ce0,&pfStack_cd8,"db",&fStack_ca0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113181;
  pfVar5 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)pfVar5 >> 8),iStack_cec == 0);
  pcStack_cd0 = pcVar8 + 0x1a;
  unaff_R13 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
  pcVar9 = auStack_b78;
  fconfig = (fdb_config *)0x0;
  do {
    uVar10 = (uint)fconfig;
    pfVar7 = (fdb_config *)(ulong)(uVar10 - 5);
    if (uVar10 < 5) {
      pfVar7 = fconfig;
    }
    pbStackY_d10 = (btree *)0x112bea;
    sprintf((char *)unaff_R13,"key%06d",pfVar7);
    builtin_strncpy(pcVar8,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_cd0,"<end>",6);
    pfVar7 = (fdb_config *)(ulong)(uVar10 - 5);
    if (uVar10 < 5) {
      pcVar18 = "value%08d";
      pfVar7 = fconfig;
    }
    else {
      pcVar18 = "updated_value%08d";
    }
    pbStackY_d10 = (btree *)0x112c2e;
    sprintf(pcVar8,pcVar18,pfVar7);
    pfVar14 = pfStack_cd8;
    pbStackY_d10 = (btree *)0x112c3b;
    sVar3 = strlen((char *)unaff_R13);
    pbStackY_d10 = (btree *)0x112c53;
    fVar1 = fdb_set_kv(pfVar14,unaff_R13,sVar3 + 1,pcVar8,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113134;
    pfVar7 = fconfig;
    if (iStack_cec == 3) {
LAB_00112c74:
      pfVar5 = (fdb_kvs_handle *)((ulong)pfVar7 & 0xffffffffffffff01);
    }
    else if (iStack_cec == 2) {
      pfVar7 = (fdb_config *)CONCAT71((int7)((ulong)fconfig >> 8),~(byte)fconfig);
      goto LAB_00112c74;
    }
    pbStackY_d10 = (btree *)0x112c86;
    fVar1 = fdb_commit(pfStack_ce0,(fdb_commit_opt_t)pfVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113139;
    pbStackY_d10 = (btree *)0x112c9b;
    fVar1 = fdb_get_kvs_info(pfStack_cd8,(fdb_kvs_info *)pcVar9);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011313e;
    fconfig = (fdb_config *)(ulong)(uVar10 + 1);
  } while (uVar10 + 1 != 10);
  pbStackY_d10 = (btree *)0x112cc2;
  fVar1 = fdb_get_all_snap_markers(pfStack_ce0,&pfStack_cc0,(uint64_t *)&iStack_cc8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113186;
  fconfig = (fdb_config *)(CONCAT44(uStack_cc4,iStack_cc8) >> 1);
  pbStackY_d10 = (btree *)0x112cf3;
  fVar1 = fdb_compact_upto(pfStack_ce0,"./compact_test2",pfStack_cc0[(int)fconfig].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011318b;
  if (-1 < (int)(iStack_cc8 - 1U)) {
    pfVar5 = (fdb_kvs_handle *)(ulong)(iStack_cc8 - 1U);
    lStack_ca8 = (long)(int)fconfig;
    fconfig = (fdb_config *)(auStack_b78 + 0x30);
    do {
      pfVar14 = (fdb_kvs_handle *)(pfStack_cc0[(long)pfVar5].kvs_markers)->seqnum;
      pbStackY_d10 = (btree *)0x112d3e;
      fVar1 = fdb_snapshot_open(pfStack_cd8,&pfStack_cb8,(fdb_seqnum_t)pfVar14);
      if (lStack_ca8 < (long)pfVar5) {
        pfVar15 = pfVar5;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011315e;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113163;
        pbStackY_d10 = (btree *)0x112d7f;
        pfStack_cb0 = pfVar5;
        fVar1 = fdb_iterator_init(pfStack_cb8,&pfStack_cf8,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113168;
        pfVar14 = (fdb_kvs_handle *)((long)&pfVar14[-1].bub_ctx.handle + 3);
        pfVar5 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_ce8 = (fdb_kvs_handle *)0x0;
          pbStackY_d10 = (btree *)0x112da6;
          fVar1 = fdb_iterator_get(pfStack_cf8,(fdb_doc **)&pfStack_ce8);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pbStackY_d10 = (btree *)0x112dc2;
          sprintf((char *)fconfig,"key%06d",(ulong)pfVar5 & 0xffffffff);
          builtin_strncpy(pcVar8,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
          builtin_strncpy(pcStack_cd0,"<end>",6);
          pcVar9 = "value%08d";
          if (pfVar5 < pfVar14) {
            pcVar9 = "updated_value%08d";
          }
          pbStackY_d10 = (btree *)0x112e05;
          sprintf(pcVar8,pcVar9,(ulong)pfVar5 & 0xffffffff);
          unaff_R13 = pfStack_ce8;
          pcVar9 = (char *)pfStack_ce8->op_stats;
          pbStackY_d10 = (btree *)0x112e1d;
          iVar2 = bcmp(pcVar9,fconfig,*(size_t *)&pfStack_ce8->kvs_config);
          if (iVar2 != 0) {
            pbStackY_d10 = (btree *)0x113129;
            compact_upto_overwrite_test();
LAB_00113129:
            pbStackY_d10 = (btree *)0x113134;
            compact_upto_overwrite_test();
            goto LAB_00113134;
          }
          pcVar9 = (char *)(unaff_R13->field_6).seqtree;
          pbStackY_d10 = (btree *)0x112e38;
          iVar2 = bcmp(pcVar9,pcVar8,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113129;
          pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
          pbStackY_d10 = (btree *)0x112e4b;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pbStackY_d10 = (btree *)0x112e55;
          fVar1 = fdb_iterator_next(pfStack_cf8);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pbStackY_d10 = (btree *)0x112e67;
        fVar1 = fdb_iterator_close(pfStack_cf8);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
        if ((int)pfVar5 != 5) goto LAB_00113177;
        pbStackY_d10 = (btree *)0x112e83;
        fVar1 = fdb_kvs_close(pfStack_cb8);
        pfVar5 = pfStack_cb0;
        pfVar15 = pfStack_cb0;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113172;
      }
      pfVar5 = (fdb_kvs_handle *)((long)&pfVar15[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar15);
  }
  pbStackY_d10 = (btree *)0x112ec1;
  fVar1 = fdb_iterator_init(pfStack_cd8,&pfStack_cf8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113190;
  unaff_R13 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
  pcVar9 = "updated_value%08d";
  fconfig = (fdb_config *)0x0;
  do {
    pfStack_ce8 = (fdb_kvs_handle *)0x0;
    pbStackY_d10 = (btree *)0x112ef2;
    fVar1 = fdb_iterator_get(pfStack_cf8,(fdb_doc **)&pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pbStackY_d10 = (btree *)0x112f0d;
    sprintf((char *)unaff_R13,"key%06d",fconfig);
    builtin_strncpy(pcVar8,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_cd0,"<end>",6);
    pbStackY_d10 = (btree *)0x112f3d;
    sprintf(pcVar8,"updated_value%08d",fconfig);
    pfVar14 = pfStack_ce8;
    pfVar5 = (fdb_kvs_handle *)pfStack_ce8->op_stats;
    pbStackY_d10 = (btree *)0x112f54;
    iVar2 = bcmp(pfVar5,unaff_R13,*(size_t *)&pfStack_ce8->kvs_config);
    if (iVar2 != 0) goto LAB_00113143;
    pfVar5 = (fdb_kvs_handle *)(pfVar14->field_6).seqtree;
    pbStackY_d10 = (btree *)0x112f6f;
    iVar2 = bcmp(pfVar5,pcVar8,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_00113153;
    fconfig = (fdb_config *)(ulong)((int)fconfig + 1);
    pbStackY_d10 = (btree *)0x112f81;
    fdb_doc_free((fdb_doc *)pfVar14);
    pbStackY_d10 = (btree *)0x112f8b;
    fVar1 = fdb_iterator_next(pfStack_cf8);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pbStackY_d10 = (btree *)0x112f9d;
  fVar1 = fdb_iterator_close(pfStack_cf8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113195;
  if ((int)fconfig != 5) goto LAB_0011319a;
  pbStackY_d10 = (btree *)0x112fbd;
  fVar1 = fdb_free_snap_markers(pfStack_cc0,CONCAT44(uStack_cc4,iStack_cc8));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011319f;
  pbStackY_d10 = (btree *)0x112fcd;
  free(pcVar8);
  pbStackY_d10 = (btree *)0x112fd7;
  fVar1 = fdb_close(pfStack_ce0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a4;
  pbStackY_d10 = (btree *)0x112fe4;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a9;
  pbStackY_d10 = (btree *)0x112ff1;
  memleak_end();
  builtin_strncpy(acStack_c88 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_c88,"compact upto ove",0x10);
  switch(iStack_cec) {
  case 0:
    pbStackY_d10 = (btree *)0x11303b;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pbStackY_d10 = (btree *)0x1130bf;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3," (WAL)",7);
    break;
  case 2:
    pbStackY_d10 = (btree *)0x113067;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3 + 0xe,"ie/WAL)",8);
    uVar19._0_1_ = ' ';
    uVar19._1_1_ = 'H';
    uVar19._2_1_ = 'B';
    uVar19._3_1_ = '+';
    uVar20._0_1_ = 't';
    uVar20._1_1_ = 'r';
    uVar20._2_1_ = 'i';
    uVar20._3_1_ = 'e';
    goto LAB_001130a8;
  case 3:
    pbStackY_d10 = (btree *)0x11308f;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3 + 0xe,"B+trie)",8);
    uVar19._0_1_ = ' ';
    uVar19._1_1_ = 'W';
    uVar19._2_1_ = 'A';
    uVar19._3_1_ = 'L';
    uVar20._0_1_ = '/';
    uVar20._1_1_ = 'H';
    uVar20._2_1_ = 'B';
    uVar20._3_1_ = '+';
LAB_001130a8:
    pcVar8 = acStack_c88 + sVar3;
    pcVar8[0] = ' ';
    pcVar8[1] = '(';
    pcVar8[2] = 'm';
    pcVar8[3] = 'i';
    pcVar8 = acStack_c88 + sVar3 + 4;
    pcVar8[0] = 'x';
    pcVar8[1] = 'e';
    pcVar8[2] = 'd';
    pcVar8[3] = ',';
    *(undefined4 *)(acStack_c88 + sVar3 + 8) = uVar19;
    *(undefined4 *)(acStack_c88 + sVar3 + 0xc) = uVar20;
  }
  pcVar8 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar8 = "%s FAILED\n";
  }
  pbStackY_d10 = (btree *)0x113107;
  iVar2 = fprintf(_stderr,pcVar8,acStack_c88);
  return iVar2;
}

Assistant:

static int compaction_del_cb(fdb_file_handle *fhandle,
                             fdb_compaction_status status,
                             const char *kv_name,
                             fdb_doc *doc, uint64_t old_offset,
                             uint64_t new_offset,
                             void *ctx)
{
    TEST_INIT();
    fdb_status s;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db = *(fdb_kvs_handle **)ctx;
    int i;
    int n = 10; // if changing this change caller function too
    char keybuf[256];
    (void) doc;
    (void) new_offset;
    (void) old_offset;

    if (status == FDB_CS_BEGIN) {
        TEST_CHK(false);
    } else if (status == FDB_CS_END) {
        TEST_CHK(!kv_name);
        if (db) { // At end of first phase, mutate more docs...
            s = fdb_open(&dbfile, "./compact_test1", &fhandle->root->config);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_kvs_open_default(dbfile, &db, &db->kvs_config);
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "key%d", i);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            // Now insert and delete a bunch of keys (all in WAL)
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "KEY%d", i);
                s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            sprintf(keybuf, "key%d", i);
            s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_close(dbfile);
            *(fdb_kvs_handle **)ctx = NULL; // Don't run in 2nd, 3rd phases
        }
    } else if (status == FDB_CS_FLUSH_WAL) {
        TEST_CHK(false);
    } else if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(false);
    } else { // FDB_CS_BATCH_MOVE
        TEST_CHK(false);
    }
    return 0;
}